

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O2

int file_create(char *filename,int *handle)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  FILE *pFVar6;
  diskdriver *pdVar7;
  int status;
  char mode [4];
  int local_1680;
  char rootstring2 [256];
  char rootstring [256];
  char cwd [1025];
  char username [1025];
  char userroot2 [1025];
  char absURL [1025];
  char userroot [1025];
  
  status = 0;
  pcVar2 = getenv("HERA_DATA_DIRECTORY");
  if (pcVar2 == (char *)0x0) goto LAB_00116057;
  sVar3 = strlen(pcVar2);
  if (200 < sVar3) {
    return 0x69;
  }
  strcpy(rootstring,pcVar2);
  pcVar2 = strchr(rootstring,0x3b);
  if (pcVar2 == (char *)0x0) {
    rootstring2[0] = '\0';
  }
  else {
    *pcVar2 = '\0';
    strcpy(rootstring2,pcVar2 + 1);
  }
  fits_get_cwd(cwd,&status);
  sVar3 = strlen(cwd);
  if (((int)sVar3 < 0x401) && (cwd[(int)sVar3 + -1] != '/')) {
    sVar3 = strlen(cwd);
    (cwd + sVar3)[0] = '/';
    (cwd + sVar3)[1] = '\0';
  }
  sVar3 = strlen(rootstring);
  iVar1 = strncmp(rootstring,cwd,(long)(int)sVar3);
  if (iVar1 == 0) {
    strncpy(username,cwd + (int)sVar3,0x32);
    username[0x32] = '\0';
    pcVar2 = strchr(username,0x2f);
    if (pcVar2 != (char *)0x0) {
      pcVar2[1] = '\0';
      strcpy(userroot,rootstring);
      strcat(userroot,username);
      sVar3 = strlen(userroot);
      strcpy(userroot2,rootstring2);
      strcat(userroot2,username);
      sVar4 = strlen(userroot2);
      fits_relurl2url(cwd,filename,absURL,&status);
      iVar1 = strncmp(userroot,absURL,(long)(int)sVar3);
      if (iVar1 != 0) {
        local_1680 = (int)sVar4;
        iVar1 = strncmp(userroot2,absURL,(long)local_1680);
        if (iVar1 != 0) {
          pcVar2 = "invalid filename: path not within user directory";
          goto LAB_00115f52;
        }
      }
LAB_00116057:
      *handle = -1;
      pdVar7 = handleTable;
      lVar5 = 0;
      while( true ) {
        if (lVar5 == 10000) {
          return 0x67;
        }
        if (pdVar7->fileptr == (FILE *)0x0) break;
        lVar5 = lVar5 + 1;
        pdVar7 = pdVar7 + 1;
      }
      *handle = (int)lVar5;
      builtin_strncpy(mode,"w+b",4);
      pFVar6 = fopen64(filename,"r");
      if (pFVar6 != (FILE *)0x0) {
        fclose(pFVar6);
        return 0x69;
      }
      pFVar6 = fopen64(filename,mode);
      if (pFVar6 == (FILE *)0x0) {
        return 0x69;
      }
      pdVar7->fileptr = (FILE *)pFVar6;
      pdVar7->currentpos = 0;
      pdVar7->last_io_op = 0;
      return 0;
    }
    pcVar2 = "invalid CWD: not equal to root data directory + username";
  }
  else {
    pcVar2 = "invalid CWD: does not match root data directory";
  }
LAB_00115f52:
  ffpmsg(pcVar2);
  return 0x69;
}

Assistant:

int file_create(char *filename, int *handle)
{
    FILE *diskfile;
    int ii;
#if defined(_WIN32)
    wchar_t mode[4];
#else
    char mode[4];
#endif
 
    int status = 0, rootlen, rootlen2, slen;
    char *cptr, *cpos;
    char cwd[FLEN_FILENAME], absURL[FLEN_FILENAME];
    char rootstring[256], rootstring2[256];
    char username[FLEN_FILENAME], userroot[FLEN_FILENAME], userroot2[FLEN_FILENAME];

    cptr = getenv("HERA_DATA_DIRECTORY");
    if (cptr) {
	/* This environment variable is defined in the Hera data analysis environment. */
	/* It specifies the root directory path to the users data directories.  */
	/* CFITSIO will verify that the path to the file that is to be created */
	/* is within this root directory + the user's home directory name. */

/*
printf("env = %s\n",cptr);
*/	
        if (strlen(cptr) > 200)  /* guard against possible string overflows */
	    return(FILE_NOT_CREATED); 

	/* environment variable has the form "path/one/;/path/two/" where the */
	/* second path is optional */

	strcpy(rootstring, cptr);
	cpos = strchr(rootstring, ';');
	if (cpos) {
	    *cpos = '\0';
	    cpos++;
	    strcpy(rootstring2, cpos);
	} else {
	  *rootstring2 = '\0';
	}
/*
printf("%s, %s\n", rootstring, rootstring2);
printf("CWD = %s\n", cwd); 
printf("rootstring=%s, cwd=%s.\n", rootstring, cwd);
*/
	/* Get the current working directory */
	fits_get_cwd(cwd, &status);  
	slen = strlen(cwd);
	if ((slen < FLEN_FILENAME) && cwd[slen-1] != '/') strcat(cwd,"/"); /* make sure the CWD ends with slash */


	/* check that CWD string matches the rootstring */
	rootlen = strlen(rootstring);
	if (strncmp(rootstring, cwd, rootlen)) {
	    ffpmsg("invalid CWD: does not match root data directory");
	    return(FILE_NOT_CREATED); 
	} else {

	    /* get the user name from CWD (it follows the root string) */
	    strncpy(username, cwd+rootlen, 50);  /* limit length of user name */
            username[50]=0;
	    cpos=strchr(username, '/');
	    if (!cpos) {
               ffpmsg("invalid CWD: not equal to root data directory + username");
               return(FILE_NOT_CREATED); 
	    } else {
	        *(cpos+1) = '\0';   /* truncate user name string */

		/* construct full user root name */
		strcpy(userroot, rootstring);
		strcat(userroot, username);
		rootlen = strlen(userroot);

		/* construct alternate full user root name */
		strcpy(userroot2, rootstring2);
		strcat(userroot2, username);
		rootlen2 = strlen(userroot2);

		/* convert the input filename to absolute path relative to the CWD */
		fits_relurl2url(cwd,  filename,  absURL, &status);

/*
printf("username = %s\n", username);
printf("userroot = %s\n", userroot);
printf("userroot2 = %s\n", userroot2);
printf("filename = %s\n", filename);
printf("ABS = %s\n", absURL);
*/
		/* check that CWD string matches the rootstring or alternate root string */

		if ( strncmp(userroot,  absURL, rootlen)  &&
		   strncmp(userroot2, absURL, rootlen2) ) {
		   ffpmsg("invalid filename: path not within user directory");
		   return(FILE_NOT_CREATED); 
		}
	    }
	}
	/* if we got here, then the input filename appears to be valid */
    }
    
    *handle = -1;
    for (ii = 0; ii < NMAXFILES; ii++)  /* find empty slot in table */
    {
        if (handleTable[ii].fileptr == 0)
        {
            *handle = ii;
            break;
        }
    }
    if (*handle == -1)
       return(TOO_MANY_FILES);    /* too many files opened */

#if defined(_WIN32)
    wcscpy(mode, L"w+b");    /* create new file with read-write */
    /* Windows
    *
    *  Assume that the input filename is in UTF-8 encoding and convert to UTF-16.
    */
    UINT inputCodePage = CP_UTF8;
    /*
    *  For UTF-8, dwFlags must be set to either 0 or
    *  MB_ERR_INVALID_CHARS.
    */
    DWORD flags = 0;
    int outputLength = 0, rc = 0;

    /*
    *  Call MultiByteToWideChar with an output buffer size of zero to determine
    *  how large an output buffer is actually necessary.
    */
    outputLength = MultiByteToWideChar(
        inputCodePage,
        flags,
        filename,
        -1,
        NULL,
        0
    );

    /*
    *  Actually convert the file name to UTF-16
    */
    wchar_t* wideFilename = (wchar_t*)malloc(sizeof(wchar_t) * outputLength);

    rc = MultiByteToWideChar(
        inputCodePage,
        flags,
        filename,
        -1,
        wideFilename,
        outputLength
    );
    
    if (0 == rc) return (FILE_NOT_CREATED);

#else
    strcpy(mode, "w+b");    /* create new file with read-write */
#endif

#if defined(_WIN32)
    diskfile = _wfopen(wideFilename, L"r");  /* does file already exist? */
    if (diskfile)
    {
        fclose(diskfile);         /* close file and exit with error */
        free(wideFilename);
        return(FILE_NOT_CREATED); 
    }
#else
    diskfile = fopen(filename, "r"); /* does file already exist? */
    if (diskfile)
    {
        fclose(diskfile);         /* close file and exit with error */
        return(FILE_NOT_CREATED); 
    }
#endif

#if MACHINE == ALPHAVMS || MACHINE == VAXVMS
        /* specify VMS record structure: fixed format, 2880 byte records */
        /* but force stream mode access to enable random I/O access      */
    diskfile = fopen(filename, mode, "rfm=fix", "mrs=2880", "ctx=stm"); 
#elif defined (_WIN32)
    diskfile = _wfopen(wideFilename, mode);
    free(wideFilename);
#else
    diskfile = fopen(filename, mode); 
#endif

    if (!(diskfile))           /* couldn't create file */
    {
            return(FILE_NOT_CREATED); 
    }

    handleTable[ii].fileptr = diskfile;
    handleTable[ii].currentpos = 0;
    handleTable[ii].last_io_op = IO_SEEK;

    return(0);
}